

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<double>::Subst_Backward(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  double dVar1;
  double dVar2;
  double **ppdVar3;
  double *pdVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar8 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if ((lVar8 != CONCAT44(extraout_var,iVar5)) ||
     ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Subst_Backward(TPZFMatrix<TVar> *) const [TVar = double]"
               ,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
  }
  iVar5 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  if (CONCAT44(extraout_var_00,iVar5) != 0) {
    for (lVar8 = 0; lVar10 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
        lVar9 = CONCAT44(extraout_var_00,iVar5), lVar8 < lVar10; lVar8 = lVar8 + 1) {
      while (lVar10 = lVar9 + -1, 1 < lVar9) {
        pdVar6 = TPZFMatrix<double>::operator()(B,lVar10,lVar8);
        if ((*pdVar6 != 0.0) || (lVar9 = lVar10, NAN(*pdVar6))) break;
      }
      for (; 0 < lVar10; lVar10 = lVar10 + -1) {
        ppdVar3 = (this->fElem).fStore;
        pdVar6 = ppdVar3[lVar10];
        pdVar4 = ppdVar3[lVar10 + 1];
        pdVar7 = TPZFMatrix<double>::operator()(B,lVar10,lVar8);
        dVar1 = *pdVar7;
        dVar2 = *pdVar6;
        *pdVar7 = dVar1 / dVar2;
        while( true ) {
          pdVar6 = pdVar6 + 1;
          pdVar7 = pdVar7 + -1;
          if (pdVar4 <= pdVar6) break;
          *pdVar7 = *pdVar7 - *pdVar6 * (dVar1 / dVar2);
        }
      }
    }
    for (lVar8 = 0; lVar8 < lVar10; lVar8 = lVar8 + 1) {
      dVar1 = **(this->fElem).fStore;
      pdVar6 = TPZFMatrix<double>::operator()(B,0,lVar8);
      *pdVar6 = *pdVar6 / dVar1;
      lVar10 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Backward(B)");
#endif
    int64_t Dimension = this->Dim();
    if(!Dimension) return 1;	// nothing to do
    int64_t j;
    for ( j = 0; j < B->Cols(); j++ )
    {
        int64_t k = Dimension-1;
        while (k>0 && (*B)(k,j) == TVar(0.)) {
            k--;
        }
        //		std::cout << "kstart " << k << std::endl;
        
        for (;k > 0; k-- )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar val;
            TVar *elem_ki = fElem[k];
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            *BPtr /= *elem_ki++;
            val = *BPtr;
            //	BPtr;
            // substract the column of the skyline matrix from the vector.
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    for( j = 0; j< B->Cols(); j++) (*B)(0,j) /= fElem[0][0];
    return( 1 );
}